

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraKateGenerator::GetPathBasename
          (string *__return_storage_ptr__,cmExtraKateGenerator *this,string *path)

{
  char cVar1;
  long lVar2;
  string local_30 [32];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)path);
  while ((__return_storage_ptr__->_M_string_length != 0 &&
         ((cVar1 = (__return_storage_ptr__->_M_dataplus)._M_p
                   [__return_storage_ptr__->_M_string_length - 1], cVar1 == '\\' || (cVar1 == '/')))
         )) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  }
  lVar2 = std::__cxx11::string::find_last_of((char *)__return_storage_ptr__,0x5d35cc);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)local_30,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_30);
    std::__cxx11::string::~string(local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraKateGenerator::GetPathBasename(
  const std::string& path) const
{
  std::string outputBasename = path;
  while (!outputBasename.empty() &&
         (outputBasename.back() == '/' || outputBasename.back() == '\\')) {
    outputBasename.resize(outputBasename.size() - 1);
  }
  std::string::size_type loc = outputBasename.find_last_of("/\\");
  if (loc != std::string::npos) {
    outputBasename = outputBasename.substr(loc + 1);
  }

  return outputBasename;
}